

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmutex.cpp
# Opt level: O0

void __thiscall QBasicMutex::destroyInternal(QBasicMutex *this,void *ptr)

{
  char *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QMutexPrivate *d;
  char *in_stack_ffffffffffffffb8;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (char *)0x0) {
    QMessageLogger::QMessageLogger
              (in_RDI,in_RSI,(int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffb8);
    QMessageLogger::warning(&local_28,"QMutex: destroying locked mutex");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBasicMutex::destroyInternal(void *ptr)
{
    auto d = static_cast<QMutexPrivate *>(ptr);
    if (!d)
        return;
    if (!futexAvailable()) {
        if (d != dummyLocked() && d->possiblyUnlocked.loadRelaxed() && tryLock()) {
            unlock();
            return;
        }
    }
    qWarning("QMutex: destroying locked mutex");
}